

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_prefix(FuncState *fs,UnOpr opr,expdesc *e,int line)

{
  int iVar1;
  OpCode op;
  int line_local;
  expdesc *e_local;
  UnOpr opr_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  if (opr < OPR_NOT) {
    iVar1 = constfolding(fs,opr + 0xc,e,&luaK_prefix::ef);
    if (iVar1 != 0) {
      return;
    }
  }
  else {
    if (opr == OPR_NOT) {
      codenot(fs,e);
      return;
    }
    if (opr != OPR_LEN) {
      return;
    }
  }
  op = unopr2op(opr);
  codeunexpval(fs,op,e,line);
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr opr, expdesc *e, int line) {
  static const expdesc ef = {VKINT, {0}, NO_JUMP, NO_JUMP};
  luaK_dischargevars(fs, e);
  switch (opr) {
    case OPR_MINUS: case OPR_BNOT:  /* use 'ef' as fake 2nd operand */
      if (constfolding(fs, cast_int(opr + LUA_OPUNM), e, &ef))
        break;
      /* else */ /* FALLTHROUGH */
    case OPR_LEN:
      codeunexpval(fs, unopr2op(opr), e, line);
      break;
    case OPR_NOT: codenot(fs, e); break;
    default: lua_assert(0);
  }
}